

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdso_support.cc
# Opt level: O0

void __thiscall absl::lts_20250127::debugging_internal::VDSOSupport::VDSOSupport(VDSOSupport *this)

{
  undefined4 *puVar1;
  void *local_20;
  VDSOSupport *this_local;
  
  puVar1 = (undefined4 *)
           std::atomic<const_void_*>::load((atomic<const_void_*> *)&vdso_base_,memory_order_relaxed)
  ;
  if (puVar1 == &ElfMemImage::kInvalidBaseSentinel) {
    local_20 = Init();
  }
  else {
    local_20 = std::atomic<const_void_*>::load
                         ((atomic<const_void_*> *)&vdso_base_,memory_order_relaxed);
  }
  ElfMemImage::ElfMemImage(&this->image_,local_20);
  return;
}

Assistant:

VDSOSupport::VDSOSupport()
    // If vdso_base_ is still set to kInvalidBase, we got here
    // before VDSOSupport::Init has been called. Call it now.
    : image_(vdso_base_.load(std::memory_order_relaxed) ==
                     debugging_internal::ElfMemImage::kInvalidBase
                 ? Init()
                 : vdso_base_.load(std::memory_order_relaxed)) {}